

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

size_t Catch::listTestsNamesOnly(Config *config)

{
  pointer pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  IRegistryHub *pIVar3;
  undefined4 extraout_var_01;
  ostream *poVar4;
  size_t sVar5;
  undefined1 auVar6 [8];
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_110;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_f8;
  undefined1 auStack_d8 [8];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  pointer local_90;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> vStack_88;
  TagAliasRegistry *local_70;
  string local_68;
  undefined1 auStack_48 [8];
  TestSpec testSpec;
  
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)auStack_48
             ,(vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
              CONCAT44(extraout_var,iVar2));
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar2) == ((long *)CONCAT44(extraout_var_00,iVar2))[1]) {
    TagAliasRegistry::get();
    local_b0._M_local_buf[0] = '\0';
    local_a0._M_allocated_capacity = 0;
    local_a0._8_8_ = (pointer)0x0;
    local_90 = (pointer)0x0;
    vStack_88.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_88.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_88.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70 = &TagAliasRegistry::get::instance;
    matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&local_b0;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"*","");
    this = TestSpecParser::parse((TestSpecParser *)auStack_d8,&local_68);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              (&local_f8,&(this->m_testSpec).m_filters);
    local_110.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         testSpec.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_110.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         testSpec.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_110.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_48;
    auStack_48 = (undefined1  [8])
                 local_f8.
                 super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_f8.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f8.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_f8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_110);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&vStack_88);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage != &local_b0) {
      operator_delete(matchedTestCases.
                      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
  }
  auStack_d8 = (undefined1  [8])0x0;
  matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])(pIVar3);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x18))
            ((long *)CONCAT44(extraout_var_01,iVar2),auStack_48,config,auStack_d8,0);
  pTVar1 = matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar5 = 0;
  for (auVar6 = auStack_d8; auVar6 != (undefined1  [8])pTVar1;
      auVar6 = (undefined1  [8])((long)auVar6 + 0x118)) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (((pointer)auVar6)->super_TestCaseInfo).name._M_dataplus._M_p,
                        (((pointer)auVar6)->super_TestCaseInfo).name._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    sVar5 = sVar5 + 1;
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)auStack_d8);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)auStack_48
            );
  return sVar5;
}

Assistant:

inline std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( !config.testSpec().hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases;
        getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, config, matchedTestCases );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Catch::cout() << testCaseInfo.name << std::endl;
        }
        return matchedTests;
    }